

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O3

float deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::getExpectedValue
                (DataType type,int id,char *name)

{
  deUint32 dVar1;
  uint uVar2;
  
  dVar1 = deStringHash(name);
  uVar2 = ((uint)id >> 0x10 ^ id ^ 0x3d) * 9;
  uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
  uVar2 = (uVar2 >> 0xf ^ uVar2) + dVar1;
  if (type - TYPE_SAMPLER_1D < 0x1e) {
    if (type - TYPE_SAMPLER_1D < 6) goto LAB_0152669c;
    if (5 < type - TYPE_INT_SAMPLER_1D) {
      if (type - TYPE_UINT_SAMPLER_1D < 6) goto LAB_01526676;
      type = (DataType)(type - TYPE_SAMPLER_1D_SHADOW < 5);
      goto LAB_0152665a;
    }
  }
  else {
LAB_0152665a:
    if (3 < type - TYPE_INT) {
      if (type - TYPE_UINT < 4) {
LAB_01526676:
        return (float)(int)(uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2);
      }
      if (type - TYPE_FLOAT < 4) {
LAB_0152669c:
        return (float)(int)(uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2) / 255.0;
      }
      if (3 < type - TYPE_BOOL) {
        return 0.0;
      }
      uVar2 = uVar2 & 1;
      goto LAB_01526665;
    }
  }
  uVar2 = uVar2 & 0x7f;
LAB_01526665:
  return (float)uVar2;
}

Assistant:

float UniformLocationCase::getExpectedValue (glu::DataType type, int id, const char* name)
{
	const deUint32	hash			= deStringHash(name) + deInt32Hash(id);

	glu::DataType	adjustedType	= type;

	if (glu::isDataTypeSampler(type))
		adjustedType = getDataTypeSamplerSampleType(type);

	if (glu::isDataTypeIntOrIVec(adjustedType))
		return float(hash%128);
	else if (glu::isDataTypeUintOrUVec(adjustedType))
		return float(hash%255);
	else if (glu::isDataTypeFloatOrVec(adjustedType))
		return float(hash%255)/255.0f;
	else if (glu::isDataTypeBoolOrBVec(adjustedType))
		return float(hash%2);
	else
		DE_FATAL("Unkown primitive type");

	return glu::TYPE_INVALID;
}